

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationUtil.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)18>_> * __thiscall
vkt::synchronization::GraphicsPipelineBuilder::build
          (Move<vk::Handle<(vk::HandleType)18>_> *__return_storage_ptr__,
          GraphicsPipelineBuilder *this,DeviceInterface *vk,VkDevice device,
          VkPipelineLayout pipelineLayout,VkRenderPass renderPass,
          PipelineCacheData *pipelineCacheData)

{
  undefined8 uVar1;
  Handle<(vk::HandleType)15> pipelineCache;
  VkPrimitiveTopology VVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  Move<vk::Handle<(vk::HandleType)18>_> *pipeline;
  VkPipelineTessellationStateCreateInfo *pVVar6;
  bool bVar7;
  RefBase<vk::Handle<(vk::HandleType)15>_> local_2f8;
  VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo;
  VkRect2D scissor;
  VkViewport res;
  VkPipelineTessellationStateCreateInfo pipelineTessellationStateInfo;
  RefBase<vk::Handle<(vk::HandleType)15>_> local_278;
  VkPipelineColorBlendAttachmentState local_258;
  VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo;
  VkPipelineViewportStateCreateInfo pipelineViewportStateInfo;
  VkPipelineVertexInputStateCreateInfo vertexInputStateInfo;
  VkPipelineColorBlendStateCreateInfo local_1a0;
  VkPipelineRasterizationStateCreateInfo local_168;
  VkPipelineDepthStencilStateCreateInfo local_128;
  VkGraphicsPipelineCreateInfo graphicsPipelineInfo;
  
  graphicsPipelineInfo.pVertexInputState = &vertexInputStateInfo;
  vertexInputStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  vertexInputStateInfo.pNext = (void *)0x0;
  vertexInputStateInfo.flags = 0;
  vertexInputStateInfo.pVertexBindingDescriptions =
       (this->m_vertexInputBindings).
       super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pVVar6 = (VkPipelineTessellationStateCreateInfo *)0x0;
  lVar3 = (long)(this->m_vertexInputBindings).
                super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)vertexInputStateInfo.pVertexBindingDescriptions;
  if (lVar3 == 0) {
    vertexInputStateInfo.pVertexBindingDescriptions = (VkVertexInputBindingDescription *)pVVar6;
  }
  vertexInputStateInfo.vertexBindingDescriptionCount = (deUint32)(lVar3 / 0xc);
  vertexInputStateInfo.pVertexAttributeDescriptions =
       (this->m_vertexInputAttributes).
       super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
       ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(this->m_vertexInputAttributes).
                super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)vertexInputStateInfo.pVertexAttributeDescriptions;
  if (uVar4 == 0) {
    vertexInputStateInfo.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)pVVar6;
  }
  vertexInputStateInfo.vertexAttributeDescriptionCount = (deUint32)(uVar4 >> 4);
  bVar7 = (this->m_shaderStageFlags & 2) == 0;
  VVar2 = VK_PRIMITIVE_TOPOLOGY_PATCH_LIST;
  if (bVar7) {
    VVar2 = this->m_primitiveTopology;
  }
  pipelineInputAssemblyStateInfo.pNext = (void *)0x0;
  pipelineInputAssemblyStateInfo.primitiveRestartEnable = 0;
  pipelineInputAssemblyStateInfo._28_4_ = 0;
  pipelineInputAssemblyStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO
  ;
  pipelineInputAssemblyStateInfo._4_4_ = 0;
  pipelineInputAssemblyStateInfo._16_8_ = (ulong)VVar2 << 0x20;
  graphicsPipelineInfo.pTessellationState = &pipelineTessellationStateInfo;
  if (bVar7) {
    graphicsPipelineInfo.pTessellationState = pVVar6;
  }
  pipelineTessellationStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO;
  pipelineTessellationStateInfo.pNext = (void *)0x0;
  pipelineTessellationStateInfo.flags = 0;
  pipelineTessellationStateInfo.patchControlPoints = this->m_patchControlPoints;
  pipelineViewportStateInfo.pViewports = &res;
  res.x = 0.0;
  res.y = 0.0;
  uVar1 = *(undefined8 *)(this->m_renderSize).m_data;
  res.width = (float)(int)uVar1;
  res.height = (float)(int)((ulong)uVar1 >> 0x20);
  scissor.extent = *(VkExtent2D *)(this->m_renderSize).m_data;
  pipelineViewportStateInfo.pScissors = &scissor;
  scissor.offset.x = 0;
  scissor.offset.y = 0;
  graphicsPipelineInfo.pViewportState = &pipelineViewportStateInfo;
  pipelineViewportStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  pipelineViewportStateInfo.pNext = (void *)0x0;
  res.minDepth = 0.0;
  res.maxDepth = 1.0;
  pipelineViewportStateInfo.flags = 0;
  pipelineViewportStateInfo.viewportCount = 1;
  pipelineViewportStateInfo.scissorCount = 1;
  graphicsPipelineInfo.pRasterizationState = &local_168;
  local_168.sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  uVar5 = this->m_shaderStageFlags & 0x10;
  local_168.rasterizerDiscardEnable = uVar5 >> 4 ^ 1;
  local_168.pNext = (void *)0x0;
  local_168.flags = 0;
  local_168.depthClampEnable = 0;
  local_168.polygonMode = VK_POLYGON_MODE_FILL;
  local_168.cullMode = this->m_cullModeFlags;
  local_168.frontFace = this->m_frontFace;
  graphicsPipelineInfo.pMultisampleState = &pipelineMultisampleStateInfo;
  pipelineMultisampleStateInfo.pNext = (void *)0x0;
  pipelineMultisampleStateInfo.sampleShadingEnable = 0;
  pipelineMultisampleStateInfo.minSampleShading = 0.0;
  pipelineMultisampleStateInfo.pSampleMask = (VkSampleMask *)0x0;
  pipelineMultisampleStateInfo.alphaToCoverageEnable = 0;
  pipelineMultisampleStateInfo.alphaToOneEnable = 0;
  pipelineMultisampleStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  pipelineMultisampleStateInfo._4_4_ = 0;
  pipelineMultisampleStateInfo.flags = 0;
  pipelineMultisampleStateInfo.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
  graphicsPipelineInfo.pDepthStencilState = &local_128;
  local_128.sType = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  local_128.depthWriteEnable = 0;
  local_128.depthCompareOp = VK_COMPARE_OP_LESS;
  local_128.pNext = (void *)0x0;
  local_128.flags = 0;
  local_128.depthTestEnable = 0;
  local_128.minDepthBounds = 0.0;
  local_128.maxDepthBounds = 1.0;
  local_168.depthBiasEnable = 0;
  local_168.depthBiasConstantFactor = 0.0;
  local_168.depthBiasClamp = 0.0;
  local_168.depthBiasSlopeFactor = 0.0;
  local_168.lineWidth = 1.0;
  local_128.depthBoundsTestEnable = 0;
  local_128.stencilTestEnable = 0;
  local_128.front.failOp = VK_STENCIL_OP_KEEP;
  local_128.front.passOp = VK_STENCIL_OP_KEEP;
  local_128.front.depthFailOp = VK_STENCIL_OP_KEEP;
  local_128.front.compareOp = VK_COMPARE_OP_NEVER;
  local_128.front.compareMask = 0;
  local_128.front.writeMask = 0;
  local_128.front.reference = 0;
  local_128.back.failOp = VK_STENCIL_OP_KEEP;
  local_128.back.passOp = VK_STENCIL_OP_KEEP;
  local_128.back.depthFailOp = VK_STENCIL_OP_KEEP;
  local_128.back.compareOp = VK_COMPARE_OP_NEVER;
  local_128.back.compareMask = 0;
  local_128.back.writeMask = 0;
  local_128.back.reference = 0;
  local_1a0.pAttachments = &local_258;
  local_258.blendEnable = (VkBool32)this->m_blendEnable;
  graphicsPipelineInfo.pColorBlendState = &local_1a0;
  local_1a0.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_1a0.pNext = (void *)0x0;
  local_1a0.flags = 0;
  local_1a0.logicOpEnable = 0;
  local_1a0.logicOp = VK_LOGIC_OP_COPY;
  local_1a0.attachmentCount = 1;
  local_258.srcColorBlendFactor = VK_BLEND_FACTOR_SRC_ALPHA;
  local_258.dstColorBlendFactor = VK_BLEND_FACTOR_ONE;
  local_258.colorBlendOp = VK_BLEND_OP_ADD;
  local_258.srcAlphaBlendFactor = VK_BLEND_FACTOR_SRC_ALPHA;
  local_258.dstAlphaBlendFactor = VK_BLEND_FACTOR_ONE;
  local_258.alphaBlendOp = VK_BLEND_OP_ADD;
  local_258.colorWriteMask = 0xf;
  graphicsPipelineInfo.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  graphicsPipelineInfo.pNext = (void *)0x0;
  graphicsPipelineInfo.flags = 0;
  local_1a0.blendConstants[0] = 0.0;
  local_1a0.blendConstants[1] = 0.0;
  local_1a0.blendConstants[2] = 0.0;
  local_1a0.blendConstants[3] = 0.0;
  graphicsPipelineInfo.pStages =
       (this->m_shaderStages).
       super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  graphicsPipelineInfo.stageCount =
       (deUint32)
       (((long)(this->m_shaderStages).
               super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)graphicsPipelineInfo.pStages) /
       0x30);
  graphicsPipelineInfo.pInputAssemblyState = &pipelineInputAssemblyStateInfo;
  if (uVar5 == 0) {
    graphicsPipelineInfo.pViewportState = (VkPipelineViewportStateCreateInfo *)0x0;
    graphicsPipelineInfo.pMultisampleState = (VkPipelineMultisampleStateCreateInfo *)0x0;
    graphicsPipelineInfo.pDepthStencilState = (VkPipelineDepthStencilStateCreateInfo *)0x0;
    graphicsPipelineInfo.pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)0x0;
  }
  graphicsPipelineInfo.pDynamicState = (VkPipelineDynamicStateCreateInfo *)0x0;
  graphicsPipelineInfo.subpass = 0;
  graphicsPipelineInfo.basePipelineHandle.m_internal = 0;
  graphicsPipelineInfo.basePipelineIndex = 0;
  graphicsPipelineInfo.layout.m_internal = pipelineLayout.m_internal;
  graphicsPipelineInfo.renderPass.m_internal = renderPass.m_internal;
  PipelineCacheData::createPipelineCache
            ((Move<vk::Handle<(vk::HandleType)15>_> *)&local_278,pipelineCacheData,vk,device);
  local_2f8.m_data.deleter.m_device = local_278.m_data.deleter.m_device;
  local_2f8.m_data.deleter.m_allocator = local_278.m_data.deleter.m_allocator;
  local_2f8.m_data.object.m_internal = local_278.m_data.object.m_internal;
  local_2f8.m_data.deleter.m_deviceIface = local_278.m_data.deleter.m_deviceIface;
  local_278.m_data.object.m_internal = 0;
  local_278.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_278.m_data.deleter.m_device = (VkDevice)0x0;
  local_278.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::~RefBase(&local_278);
  pipelineCache.m_internal = local_2f8.m_data.object.m_internal;
  ::vk::createGraphicsPipeline
            (__return_storage_ptr__,vk,device,(VkPipelineCache)local_2f8.m_data.object.m_internal,
             &graphicsPipelineInfo,(VkAllocationCallbacks *)0x0);
  PipelineCacheData::setFromPipelineCache
            (pipelineCacheData,vk,device,(VkPipelineCache)pipelineCache.m_internal);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::~RefBase(&local_2f8);
  return __return_storage_ptr__;
}

Assistant:

Move<VkPipeline> GraphicsPipelineBuilder::build (const DeviceInterface&	vk,
												 const VkDevice			device,
												 const VkPipelineLayout	pipelineLayout,
												 const VkRenderPass		renderPass,
												 PipelineCacheData&		pipelineCacheData)
{
	const VkPipelineVertexInputStateCreateInfo vertexInputStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,		// VkStructureType                             sType;
		DE_NULL,														// const void*                                 pNext;
		(VkPipelineVertexInputStateCreateFlags)0,						// VkPipelineVertexInputStateCreateFlags       flags;
		static_cast<deUint32>(m_vertexInputBindings.size()),			// uint32_t                                    vertexBindingDescriptionCount;
		dataPointer(m_vertexInputBindings),								// const VkVertexInputBindingDescription*      pVertexBindingDescriptions;
		static_cast<deUint32>(m_vertexInputAttributes.size()),			// uint32_t                                    vertexAttributeDescriptionCount;
		dataPointer(m_vertexInputAttributes),							// const VkVertexInputAttributeDescription*    pVertexAttributeDescriptions;
	};

	const VkPrimitiveTopology topology = (m_shaderStageFlags & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) ? VK_PRIMITIVE_TOPOLOGY_PATCH_LIST
																										 : m_primitiveTopology;
	const VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,	// VkStructureType                             sType;
		DE_NULL,														// const void*                                 pNext;
		(VkPipelineInputAssemblyStateCreateFlags)0,						// VkPipelineInputAssemblyStateCreateFlags     flags;
		topology,														// VkPrimitiveTopology                         topology;
		VK_FALSE,														// VkBool32                                    primitiveRestartEnable;
	};

	const VkPipelineTessellationStateCreateInfo pipelineTessellationStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO,		// VkStructureType                             sType;
		DE_NULL,														// const void*                                 pNext;
		(VkPipelineTessellationStateCreateFlags)0,						// VkPipelineTessellationStateCreateFlags      flags;
		m_patchControlPoints,											// uint32_t                                    patchControlPoints;
	};

	const VkViewport viewport = makeViewport(
		0.0f, 0.0f,
		static_cast<float>(m_renderSize.x()), static_cast<float>(m_renderSize.y()),
		0.0f, 1.0f);

	const VkRect2D scissor = {
		makeOffset2D(0, 0),
		makeExtent2D(m_renderSize.x(), m_renderSize.y()),
	};

	const VkPipelineViewportStateCreateInfo pipelineViewportStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,	// VkStructureType                             sType;
		DE_NULL,												// const void*                                 pNext;
		(VkPipelineViewportStateCreateFlags)0,					// VkPipelineViewportStateCreateFlags          flags;
		1u,														// uint32_t                                    viewportCount;
		&viewport,												// const VkViewport*                           pViewports;
		1u,														// uint32_t                                    scissorCount;
		&scissor,												// const VkRect2D*                             pScissors;
	};

	const bool isRasterizationDisabled = ((m_shaderStageFlags & VK_SHADER_STAGE_FRAGMENT_BIT) == 0);
	const VkPipelineRasterizationStateCreateInfo pipelineRasterizationStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,		// VkStructureType                          sType;
		DE_NULL,														// const void*                              pNext;
		(VkPipelineRasterizationStateCreateFlags)0,						// VkPipelineRasterizationStateCreateFlags  flags;
		VK_FALSE,														// VkBool32                                 depthClampEnable;
		isRasterizationDisabled,										// VkBool32                                 rasterizerDiscardEnable;
		VK_POLYGON_MODE_FILL,											// VkPolygonMode							polygonMode;
		m_cullModeFlags,												// VkCullModeFlags							cullMode;
		m_frontFace,													// VkFrontFace								frontFace;
		VK_FALSE,														// VkBool32									depthBiasEnable;
		0.0f,															// float									depthBiasConstantFactor;
		0.0f,															// float									depthBiasClamp;
		0.0f,															// float									depthBiasSlopeFactor;
		1.0f,															// float									lineWidth;
	};

	const VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,	// VkStructureType							sType;
		DE_NULL,													// const void*								pNext;
		(VkPipelineMultisampleStateCreateFlags)0,					// VkPipelineMultisampleStateCreateFlags	flags;
		VK_SAMPLE_COUNT_1_BIT,										// VkSampleCountFlagBits					rasterizationSamples;
		VK_FALSE,													// VkBool32									sampleShadingEnable;
		0.0f,														// float									minSampleShading;
		DE_NULL,													// const VkSampleMask*						pSampleMask;
		VK_FALSE,													// VkBool32									alphaToCoverageEnable;
		VK_FALSE													// VkBool32									alphaToOneEnable;
	};

	const VkStencilOpState stencilOpState = makeStencilOpState(
		VK_STENCIL_OP_KEEP,		// stencil fail
		VK_STENCIL_OP_KEEP,		// depth & stencil pass
		VK_STENCIL_OP_KEEP,		// depth only fail
		VK_COMPARE_OP_NEVER,	// compare op
		0u,						// compare mask
		0u,						// write mask
		0u);					// reference

	const VkPipelineDepthStencilStateCreateInfo pipelineDepthStencilStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO,	// VkStructureType							sType;
		DE_NULL,													// const void*								pNext;
		(VkPipelineDepthStencilStateCreateFlags)0,					// VkPipelineDepthStencilStateCreateFlags	flags;
		VK_FALSE,													// VkBool32									depthTestEnable;
		VK_FALSE,													// VkBool32									depthWriteEnable;
		VK_COMPARE_OP_LESS,											// VkCompareOp								depthCompareOp;
		VK_FALSE,													// VkBool32									depthBoundsTestEnable;
		VK_FALSE,													// VkBool32									stencilTestEnable;
		stencilOpState,												// VkStencilOpState							front;
		stencilOpState,												// VkStencilOpState							back;
		0.0f,														// float									minDepthBounds;
		1.0f,														// float									maxDepthBounds;
	};

	const VkColorComponentFlags colorComponentsAll = VK_COLOR_COMPONENT_R_BIT | VK_COLOR_COMPONENT_G_BIT | VK_COLOR_COMPONENT_B_BIT | VK_COLOR_COMPONENT_A_BIT;
	const VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState =
	{
		m_blendEnable,						// VkBool32					blendEnable;
		VK_BLEND_FACTOR_SRC_ALPHA,			// VkBlendFactor			srcColorBlendFactor;
		VK_BLEND_FACTOR_ONE,				// VkBlendFactor			dstColorBlendFactor;
		VK_BLEND_OP_ADD,					// VkBlendOp				colorBlendOp;
		VK_BLEND_FACTOR_SRC_ALPHA,			// VkBlendFactor			srcAlphaBlendFactor;
		VK_BLEND_FACTOR_ONE,				// VkBlendFactor			dstAlphaBlendFactor;
		VK_BLEND_OP_ADD,					// VkBlendOp				alphaBlendOp;
		colorComponentsAll,					// VkColorComponentFlags	colorWriteMask;
	};

	const VkPipelineColorBlendStateCreateInfo pipelineColorBlendStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,	// VkStructureType								sType;
		DE_NULL,													// const void*									pNext;
		(VkPipelineColorBlendStateCreateFlags)0,					// VkPipelineColorBlendStateCreateFlags			flags;
		VK_FALSE,													// VkBool32										logicOpEnable;
		VK_LOGIC_OP_COPY,											// VkLogicOp									logicOp;
		1u,															// deUint32										attachmentCount;
		&pipelineColorBlendAttachmentState,							// const VkPipelineColorBlendAttachmentState*	pAttachments;
		{ 0.0f, 0.0f, 0.0f, 0.0f },									// float										blendConstants[4];
	};

	const VkGraphicsPipelineCreateInfo graphicsPipelineInfo =
	{
		VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,						// VkStructureType									sType;
		DE_NULL,																// const void*										pNext;
		(VkPipelineCreateFlags)0,												// VkPipelineCreateFlags							flags;
		static_cast<deUint32>(m_shaderStages.size()),							// deUint32											stageCount;
		&m_shaderStages[0],														// const VkPipelineShaderStageCreateInfo*			pStages;
		&vertexInputStateInfo,													// const VkPipelineVertexInputStateCreateInfo*		pVertexInputState;
		&pipelineInputAssemblyStateInfo,										// const VkPipelineInputAssemblyStateCreateInfo*	pInputAssemblyState;
		(m_shaderStageFlags & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT ? &pipelineTessellationStateInfo : DE_NULL), // const VkPipelineTessellationStateCreateInfo*		pTessellationState;
		(isRasterizationDisabled ? DE_NULL : &pipelineViewportStateInfo),		// const VkPipelineViewportStateCreateInfo*			pViewportState;
		&pipelineRasterizationStateInfo,										// const VkPipelineRasterizationStateCreateInfo*	pRasterizationState;
		(isRasterizationDisabled ? DE_NULL : &pipelineMultisampleStateInfo),	// const VkPipelineMultisampleStateCreateInfo*		pMultisampleState;
		(isRasterizationDisabled ? DE_NULL : &pipelineDepthStencilStateInfo),	// const VkPipelineDepthStencilStateCreateInfo*		pDepthStencilState;
		(isRasterizationDisabled ? DE_NULL : &pipelineColorBlendStateInfo),		// const VkPipelineColorBlendStateCreateInfo*		pColorBlendState;
		DE_NULL,																// const VkPipelineDynamicStateCreateInfo*			pDynamicState;
		pipelineLayout,															// VkPipelineLayout									layout;
		renderPass,																// VkRenderPass										renderPass;
		0u,																		// deUint32											subpass;
		DE_NULL,																// VkPipeline										basePipelineHandle;
		0,																		// deInt32											basePipelineIndex;
	};

	{
		const vk::Unique<vk::VkPipelineCache>	pipelineCache	(pipelineCacheData.createPipelineCache(vk, device));
		vk::Move<vk::VkPipeline>				pipeline		(createGraphicsPipeline(vk, device, *pipelineCache, &graphicsPipelineInfo));

		// Refresh data from cache
		pipelineCacheData.setFromPipelineCache(vk, device, *pipelineCache);

		return pipeline;
	}
}